

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O3

int delta_encode_cost(int *colors,int num,int bit_depth,int min_val)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int aiStack_48 [8];
  int deltas [8];
  
  if (num < 1) {
    return 0;
  }
  if (num == 1) {
    return bit_depth;
  }
  iVar2 = bit_depth + 2;
  iVar5 = *colors;
  lVar3 = 0;
  iVar7 = 0;
  iVar8 = iVar5;
  do {
    iVar6 = colors[lVar3 + 1];
    iVar8 = iVar6 - iVar8;
    aiStack_48[lVar3] = iVar8;
    if (iVar8 <= iVar7) {
      iVar8 = iVar7;
    }
    iVar7 = iVar8;
    lVar3 = lVar3 + 1;
    iVar8 = iVar6;
  } while ((ulong)(uint)num - 1 != lVar3);
  iVar5 = (1 << ((byte)bit_depth & 0x1f)) - (iVar5 + min_val);
  uVar9 = iVar7 - min_val;
  uVar1 = 0x1f;
  if (uVar9 != 0) {
    for (; uVar9 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  iVar8 = (uVar1 ^ 0xffffffe0) + 0x21;
  if ((int)(uVar9 + 1) < 2) {
    iVar8 = 0;
  }
  if (iVar8 <= bit_depth + -3) {
    iVar8 = bit_depth + -3;
  }
  iVar7 = 2;
  if (2 < num) {
    iVar7 = num;
  }
  uVar4 = 0;
  do {
    iVar2 = iVar2 + iVar8;
    iVar5 = iVar5 - aiStack_48[uVar4];
    uVar1 = 0x1f;
    if (iVar5 - 1U != 0) {
      for (; iVar5 - 1U >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar6 = (uVar1 ^ 0xffffffe0) + 0x21;
    if (iVar5 < 2) {
      iVar6 = 0;
    }
    if (iVar6 <= iVar8) {
      iVar8 = iVar6;
    }
    uVar4 = uVar4 + 1;
  } while (iVar7 - 1 != uVar4);
  return iVar2;
}

Assistant:

static int delta_encode_cost(const int *colors, int num, int bit_depth,
                             int min_val) {
  if (num <= 0) return 0;
  int bits_cost = bit_depth;
  if (num == 1) return bits_cost;
  bits_cost += 2;
  int max_delta = 0;
  int deltas[PALETTE_MAX_SIZE];
  const int min_bits = bit_depth - 3;
  for (int i = 1; i < num; ++i) {
    const int delta = colors[i] - colors[i - 1];
    deltas[i - 1] = delta;
    assert(delta >= min_val);
    if (delta > max_delta) max_delta = delta;
  }
  int bits_per_delta = AOMMAX(av1_ceil_log2(max_delta + 1 - min_val), min_bits);
  assert(bits_per_delta <= bit_depth);
  int range = (1 << bit_depth) - colors[0] - min_val;
  for (int i = 0; i < num - 1; ++i) {
    bits_cost += bits_per_delta;
    range -= deltas[i];
    bits_per_delta = AOMMIN(bits_per_delta, av1_ceil_log2(range));
  }
  return bits_cost;
}